

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
pegmatite::Context::parse_rule(Context *this,Rule *r,offset_in_Context_to_subr parse_func)

{
  __node_base *p_Var1;
  size_type *psVar2;
  pointer *ppRVar3;
  iterator __position;
  undefined8 *puVar4;
  undefined8 uVar5;
  _Hash_node_base *p_Var6;
  __buckets_ptr pp_Var7;
  const_iterator __position_00;
  pointer pPVar8;
  Rule *pRVar9;
  Input *pIVar10;
  Index IVar11;
  Index IVar12;
  vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_> *pvVar13;
  char cVar14;
  __node_ptr p_Var15;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  __first;
  undefined8 *puVar16;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var17;
  long in_RCX;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  _Var18;
  code *pcVar19;
  key_type *__key;
  size_type __n;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  size_type sVar23;
  _Hash_node_base _Var24;
  long *plVar25;
  size_t sVar26;
  ulong uVar27;
  MatchMode MVar28;
  undefined1 auVar29 [16];
  __buckets_alloc_type __alloc;
  CacheKey k;
  RuleState local_90;
  code *local_80;
  size_t local_78;
  Rule *local_70;
  ulong local_68;
  long local_60;
  vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_> *local_58;
  ParserPosition *local_50;
  anon_struct_8_0_00000001_for___align local_48;
  Input *pIStack_40;
  Index IStack_38;
  
  local_60 = in_RCX;
  local_48 = (anon_struct_8_0_00000001_for___align)r;
  local_58 = std::__detail::
             _Map_base<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->rule_states,(key_type *)&local_48);
  __position._M_current =
       (local_58->
       super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((local_58->
      super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
      )._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
    local_78 = 0xffffffffffffffff;
    MVar28 = PARSE;
  }
  else {
    local_78 = __position._M_current[-1].position;
    MVar28 = __position._M_current[-1].mode;
  }
  local_50 = &this->position;
  sVar26 = (this->position).it.idx - (this->start).idx;
  pIStack_40 = (this->position).it.buffer;
  IStack_38 = (this->position).it.idx;
  sVar23 = (this->cache)._M_h._M_bucket_count;
  uVar27 = IStack_38 * 2 ^ (ulong)r;
  local_80 = (code *)parse_func;
  local_48 = (anon_struct_8_0_00000001_for___align)r;
  p_Var15 = std::
            _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_node((_Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)(this->cache)._M_h._M_buckets,sVar23,(key_type *)(uVar27 % sVar23),
                           (__hash_code)&local_48);
  pvVar13 = local_58;
  pcVar19 = local_80;
  if (p_Var15 != (__node_ptr)0x0) {
    uVar27 = *(long *)((long)&(p_Var15->
                              super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                              ._M_storage._M_storage + 0x38) -
             *(long *)((long)&(p_Var15->
                              super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                              ._M_storage._M_storage + 0x30);
    __first._M_current =
         std::
         _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ::_M_allocate((_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                        *)(((long)uVar27 >> 3) * 0x6db6db6db6db6db7),sVar23);
    puVar4 = *(undefined8 **)
              ((long)&(p_Var15->
                      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                      ._M_storage._M_storage + 0x38);
    _Var18._M_current = __first._M_current;
    for (puVar16 = *(undefined8 **)
                    ((long)&(p_Var15->
                            super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                            ._M_storage._M_storage + 0x30); puVar16 != puVar4; puVar16 = puVar16 + 7
        ) {
      uVar5 = puVar16[6];
      ((_Var18._M_current)->source).finish.line = (int)uVar5;
      ((_Var18._M_current)->source).finish.col = (int)((ulong)uVar5 >> 0x20);
      pRVar9 = (Rule *)*puVar16;
      pIVar10 = (Input *)puVar16[1];
      IVar11 = puVar16[2];
      uVar5 = puVar16[3];
      IVar12 = puVar16[5];
      ((_Var18._M_current)->source).finish.it.buffer = (Input *)puVar16[4];
      ((_Var18._M_current)->source).finish.it.idx = IVar12;
      ((_Var18._M_current)->source).start.it.idx = IVar11;
      ((_Var18._M_current)->source).start.line = (int)uVar5;
      ((_Var18._M_current)->source).start.col = (int)((ulong)uVar5 >> 0x20);
      (_Var18._M_current)->matched_rule = pRVar9;
      ((_Var18._M_current)->source).start.it.buffer = pIVar10;
      _Var18._M_current = _Var18._M_current + 1;
    }
    std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
    ::
    insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
              ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                *)&this->matches,
               (this->matches).
               super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               ._M_impl.super__Vector_impl_data._M_finish,__first,_Var18);
    uVar5 = *(undefined8 *)
             ((long)&(p_Var15->
                     super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                     ._M_storage._M_storage + 0x28);
    local_50->line = (int)uVar5;
    local_50->col = (int)((ulong)uVar5 >> 0x20);
    IVar11 = *(Index *)((long)&(p_Var15->
                               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                               ._M_storage._M_storage + 0x20);
    (local_50->it).buffer =
         *(Input **)
          ((long)&(p_Var15->
                  super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                  ._M_storage._M_storage + 0x18);
    (local_50->it).idx = IVar11;
    if (__first._M_current == (ParseMatch *)0x0) {
      return true;
    }
    operator_delete(__first._M_current,uVar27);
    return true;
  }
  uVar22 = (long)(this->matches).
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matches).
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_70 = r;
  local_68 = uVar27;
  if (MVar28 == REJECT) {
    if (sVar26 != local_78) {
LAB_00128f19:
      local_90.mode = PARSE;
      local_90.position = sVar26;
      if (__position._M_current ==
          (local_58->
          super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        _M_realloc_insert<pegmatite::Context::RuleState>(local_58,__position,&local_90);
      }
      else {
        (__position._M_current)->position = sVar26;
        (__position._M_current)->mode = PARSE;
        *(undefined4 *)&(__position._M_current)->field_0xc = local_90._12_4_;
        ppRVar3 = &(local_58->
                   super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar3 = *ppRVar3 + 1;
      }
      plVar25 = (long *)((long)&this->whitespace_rule + local_60);
      pcVar19 = local_80;
      if (((ulong)local_80 & 1) != 0) {
        pcVar19 = *(code **)(local_80 + *plVar25 + -1);
      }
      cVar14 = (*pcVar19)(plVar25,local_70);
      ppRVar3 = &(pvVar13->
                 super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar3 = *ppRVar3 + -1;
      goto LAB_00128fad;
    }
LAB_00129156:
    bVar21 = false;
  }
  else {
    if (MVar28 == PARSE) {
      if (sVar26 != local_78) goto LAB_00128f19;
      local_90.position = local_78;
      sVar26 = local_90.position;
      local_90.mode = REJECT;
      if (__position._M_current ==
          (local_58->
          super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        _M_realloc_insert<pegmatite::Context::RuleState>(local_58,__position,&local_90);
      }
      else {
        local_90.position._0_4_ = (undefined4)local_78;
        local_90.position._4_4_ = (undefined4)(local_78 >> 0x20);
        *(undefined4 *)&(__position._M_current)->position = (undefined4)local_90.position;
        *(undefined4 *)((long)&(__position._M_current)->position + 4) = local_90.position._4_4_;
        (__position._M_current)->mode = REJECT;
        *(undefined4 *)&(__position._M_current)->field_0xc = local_90._12_4_;
        ppRVar3 = &(local_58->
                   super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar3 = *ppRVar3 + 1;
        local_90.position = sVar26;
      }
      plVar25 = (long *)((long)&this->whitespace_rule + local_60);
      if (((ulong)pcVar19 & 1) != 0) {
        pcVar19 = *(code **)(pcVar19 + *plVar25 + -1);
      }
      cVar14 = (*pcVar19)(plVar25,local_70);
      ppRVar3 = &(pvVar13->
                 super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar3 = *ppRVar3 + -1;
LAB_00128fad:
      if (cVar14 == '\0') goto LAB_00129156;
    }
    if (0x100 < (this->cache)._M_h._M_element_count) {
      std::
      _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&(this->cache)._M_h);
    }
    sVar23 = (this->cache)._M_h._M_bucket_count;
    __key = (key_type *)(local_68 % sVar23);
    p_Var15 = std::
              _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_find_node((_Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(this->cache)._M_h._M_buckets,sVar23,__key,(__hash_code)&local_48);
    if (p_Var15 == (__node_ptr)0x0) {
      p_Var15 = (__node_ptr)operator_new(0x58);
      (p_Var15->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      (p_Var15->
      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
      ._M_storage._M_storage.__align = local_48;
      *(Input **)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 8) = pIStack_40;
      *(Index *)((long)&(p_Var15->
                        super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                        ._M_storage._M_storage + 0x10) = IStack_38;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x20) = 0xffffffffffffffff;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x30) = 0;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x38) = 0;
      *(undefined8 *)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x40) = 0;
      local_78 = (this->cache)._M_h._M_rehash_policy._M_next_resize;
      auVar29 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->cache)._M_h._M_rehash_policy,
                           (this->cache)._M_h._M_bucket_count,(this->cache)._M_h._M_element_count);
      __n = auVar29._8_8_;
      if ((auVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __s = (this->cache)._M_h._M_buckets;
      }
      else {
        if (__n == 1) {
          __s = &(this->cache)._M_h._M_single_bucket;
          (this->cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_90,__n,
                           (void *)0x0);
          memset(__s,0,__n * 8);
        }
        _Var24._M_nxt = (this->cache)._M_h._M_before_begin._M_nxt;
        (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if (_Var24._M_nxt != (_Hash_node_base *)0x0) {
          p_Var1 = &(this->cache)._M_h._M_before_begin;
          uVar27 = 0;
          do {
            p_Var6 = (_Var24._M_nxt)->_M_nxt;
            uVar20 = (ulong)_Var24._M_nxt[10]._M_nxt % __n;
            if (__s[uVar20] == (_Hash_node_base *)0x0) {
              (_Var24._M_nxt)->_M_nxt = p_Var1->_M_nxt;
              p_Var1->_M_nxt = _Var24._M_nxt;
              __s[uVar20] = p_Var1;
              if ((_Var24._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                pp_Var17 = __s + uVar27;
                goto LAB_00129105;
              }
            }
            else {
              (_Var24._M_nxt)->_M_nxt = __s[uVar20]->_M_nxt;
              pp_Var17 = &__s[uVar20]->_M_nxt;
              uVar20 = uVar27;
LAB_00129105:
              *pp_Var17 = _Var24._M_nxt;
            }
            _Var24._M_nxt = p_Var6;
            uVar27 = uVar20;
          } while (p_Var6 != (_Hash_node_base *)0x0);
        }
        pp_Var7 = (this->cache)._M_h._M_buckets;
        if (&(this->cache)._M_h._M_single_bucket != pp_Var7) {
          operator_delete(pp_Var7,(this->cache)._M_h._M_bucket_count << 3);
        }
        (this->cache)._M_h._M_bucket_count = __n;
        (this->cache)._M_h._M_buckets = __s;
        __key = (key_type *)(local_68 % __n);
      }
      (p_Var15->
      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = local_68;
      if (__s[(long)__key] == (_Hash_node_base *)0x0) {
        p_Var6 = (this->cache)._M_h._M_before_begin._M_nxt;
        (p_Var15->super__Hash_node_base)._M_nxt = p_Var6;
        (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var15;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          __s[(ulong)p_Var6[10]._M_nxt % (this->cache)._M_h._M_bucket_count] =
               (__node_base_ptr)p_Var15;
          __s = (this->cache)._M_h._M_buckets;
        }
        __s[(long)__key] = &(this->cache)._M_h._M_before_begin;
      }
      else {
        (p_Var15->super__Hash_node_base)._M_nxt = __s[(long)__key]->_M_nxt;
        __s[(long)__key]->_M_nxt = (_Hash_node_base *)p_Var15;
      }
      psVar2 = &(this->cache)._M_h._M_element_count;
      *psVar2 = *psVar2 + 1;
    }
    *(undefined8 *)
     ((long)&(p_Var15->
             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
             ._M_storage._M_storage + 0x28) = *(undefined8 *)&local_50->line;
    IVar11 = (local_50->it).idx;
    *(Input **)
     ((long)&(p_Var15->
             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
             ._M_storage._M_storage + 0x18) = (local_50->it).buffer;
    *(Index *)((long)&(p_Var15->
                      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                      ._M_storage._M_storage + 0x20) = IVar11;
    __position_00._M_current =
         *(ParseMatch **)
          ((long)&(p_Var15->
                  super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                  ._M_storage._M_storage + 0x30);
    if (*(ParseMatch **)
         ((long)&(p_Var15->
                 super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                 ._M_storage._M_storage + 0x38) != __position_00._M_current) {
      *(ParseMatch **)
       ((long)&(p_Var15->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x38) = __position_00._M_current;
    }
    pPVar8 = (this->matches).
             super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var18._M_current =
         (this->matches).
         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    bVar21 = true;
    if (uVar22 < (ulong)((long)_Var18._M_current - (long)pPVar8)) {
      std::
      vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>::
      insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
                ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                  *)((p_Var15->
                     super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                     ._M_storage._M_storage.__data + 0x30),__position_00,
                 (ParseMatch *)((long)pPVar8 + uVar22),_Var18);
    }
  }
  return bVar21;
}

Assistant:

bool Context::parse_rule(const Rule &r, bool (Context::*parse_func)(const Rule &))
{
	// For each rule, we maintain a vector consisting of where it was last
	// encountered (in the input stream) and what the parsing mode was.
	auto &states = rule_states[std::addressof(r)];
	// If this is the first time that we've encountered this rule, then set the
	// last position and mode to values that will trigger a normal parse: We
	// can't be in left recursion if this is the first time that we've
	// encountered the rule.
	size_t last_pos = Input::npos;
	MatchMode last_mode = MatchMode::PARSE;
	if (!states.empty())
	{
		auto &last = states.back();
		last_pos = last.position;
		last_mode = last.mode;
	}
	// Return value (success or failure of parse)
	bool ok;

	// Compute the new position in the stream.  We're only tracking offsets to
	// detect left recursion, not storing iterators.
	size_t new_pos = position.it - start;

	// Check if we have left recursion.  We are in a left-recursive state if
	// the last time that we encountered this rule was at the same point in the
	// input.
	bool lr = new_pos == last_pos;

	// Look up the current rule and parser position in the cache to see if
	// we've been here before and successfully parsed the rule.
	CacheKey k = { std::addressof(r), position.it };
	auto cache_entry = cache.find(k);
	if (cache_entry != cache.end())
	{
		// If we have a cache entry then grab the list of matched rules and the
		// end parsing position from the cache and don't bother trying to apply
		// the rules again.
		auto cached_matches = cache_entry->second.second;
		matches.insert(matches.end(), cached_matches.begin(), cached_matches.end());
		position = cache_entry->second.first;
		return true;
	}

	size_t new_match_index = matches.size();

	switch (last_mode)
	{
		//normal parse
		case MatchMode::PARSE:
			if (lr)
			{
				//first try to parse the rule by rejecting it, so alternative
				//branches are examined
				states.push_back(RuleState(new_pos, MatchMode::REJECT));
				ok = (this->*parse_func)(r);
				states.pop_back();
				break;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
		case MatchMode::REJECT:
			if (lr)
			{
				ok = false;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
	}

	// If we successfully parsed the input, then cache the result.
	if (ok)
	{
		// To prevent the cache growing too large, if it starts to get quite
		// big, delete everything.  256is a mostly arbitrary number generated
		// by running a big(ish) parse with a few different values and finding
		// the place where the increase in memory didn't come with a noticeable
		// speedup.
		if (cache.size() > 256)
		{
			cache.clear();
		}
		// Insert the new cache entry
		auto &new_cache = cache[k];
		new_cache.first = position;
		auto &cached_matches = new_cache.second;
		cached_matches.clear();
		// If there some rules were matched, record them
		if (matches.size() > new_match_index)
		{
			const auto index =
				static_cast<Input::iterator::difference_type>(new_match_index);
			cached_matches.insert(cached_matches.begin(), matches.begin() +
					index, matches.end());
		}
	}

	return ok;
}